

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolb.c
# Opt level: O0

int ffi1fi1(uchar *input,long ntodo,double scale,double zero,uchar *output,int *status)

{
  int *in_RCX;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double dvalue;
  long ii;
  undefined8 local_38;
  
  if ((((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) {
    for (local_38 = 0; local_38 < (long)in_RSI; local_38 = local_38 + 1) {
      dVar1 = ((double)*(byte *)((long)in_RDI + local_38) - in_XMM1_Qa) / in_XMM0_Qa;
      if (-0.49 <= dVar1) {
        if (dVar1 <= 255.49) {
          *(char *)((long)in_RDX + local_38) = (char)(int)(dVar1 + 0.5);
        }
        else {
          *in_RCX = -0xb;
          *(undefined1 *)((long)in_RDX + local_38) = 0xff;
        }
      }
      else {
        *in_RCX = -0xb;
        *(undefined1 *)((long)in_RDX + local_38) = 0;
      }
    }
  }
  else {
    memcpy(in_RDX,in_RDI,in_RSI);
  }
  return *in_RCX;
}

Assistant:

int ffi1fi1(unsigned char *input,  /* I - array of values to be converted  */
            long ntodo,            /* I - number of elements in the array  */
            double scale,          /* I - FITS TSCALn or BSCALE value      */
            double zero,           /* I - FITS TZEROn or BZERO  value      */
            unsigned char *output, /* O - output array of converted values */
            int *status)           /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        memcpy(output, input, ntodo); /* just copy input to output */
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = ( ((double) input[ii]) - zero) / scale;

            if (dvalue < DUCHAR_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = 0;
            }
            else if (dvalue > DUCHAR_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = UCHAR_MAX;
            }
            else
                output[ii] = (unsigned char) (dvalue + .5);
        }
    }
    return(*status);
}